

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O3

bool __thiscall
ON_HistoryRecord::GetGeometryValue(ON_HistoryRecord *this,int value_id,ON_Geometry **g)

{
  ON_Value *pOVar1;
  bool bVar2;
  
  *g = (ON_Geometry *)0x0;
  bVar2 = false;
  pOVar1 = FindValueHelper(this,value_id,10,false);
  if (pOVar1 != (ON_Value *)0x0) {
    if (*(int *)&pOVar1[2]._vptr_ON_Value == 1) {
      *g = (ON_Geometry *)**(undefined8 **)&pOVar1[1].m_value_id;
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool ON_HistoryRecord::GetGeometryValue( int value_id, const ON_Geometry*& g ) const
{
  bool rc = false;
  g = 0;
  const ON_GeometryValue* v = static_cast<ON_GeometryValue*>(FindValueHelper(value_id,ON_Value::geometry_value,0));
  if ( v && 1 == v->m_value.Count())
  {
    g = v->m_value[0];
    rc = true;
  }
  return rc;
}